

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering::TabulatedDistribution::
TabulatedDistribution
          (TabulatedDistribution *this,double incident,int lang,
          vector<double,_std::allocator<double>_> *cosines,
          vector<double,_std::allocator<double>_> *probabilities)

{
  pointer pdVar1;
  pointer pdVar2;
  _Vector_base<double,_std::allocator<double>_> local_88;
  double local_70;
  ListRecord local_68;
  
  pdVar1 = (cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (cosines->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_70 = incident;
  generateList((vector<double,_std::allocator<double>_> *)&local_88,cosines,probabilities);
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)((long)pdVar2 - (long)pdVar1 >> 3);
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl =
       (long)local_88._M_impl.super__Vector_impl_data._M_finish -
       (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = 0;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)lang;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = local_70;
  local_68.metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl = 0.0;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_88._M_impl.super__Vector_impl_data._M_start;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_88._M_impl.super__Vector_impl_data._M_finish;
  local_68.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_88._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TabulatedDistribution(this,&local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_68.data.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

TabulatedDistribution( double incident, int lang,
                       std::vector< double >&& cosines,
                       std::vector< double >&& probabilities )
  try : TabulatedDistribution( ListRecord( 0.0, incident, lang, 0,
                                           cosines.size(),
                                           generateList( std::move( cosines ),
                                                         std::move( probabilities ) ) ) ) {}
  catch ( std::exception& e ) {

    Log::info( "Encountered error while reading tabulated distribution data "
               "(LAW=2 LANG={})", lang );
    throw;
  }